

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

void __thiscall
tetgenmesh::restorecavity
          (tetgenmesh *this,arraypool *crosstets,arraypool *topnewtets,arraypool *botnewtets,
          arraypool *missingshbds)

{
  uint *puVar1;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  ulong uVar9;
  memorypool *pmVar10;
  ulong uVar11;
  long lVar12;
  char **ppcVar13;
  ulong uVar14;
  long *plVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  undefined8 *puVar20;
  long lVar21;
  uint uVar22;
  long *plVar23;
  
  lVar21 = crosstets->objects;
  if (0 < lVar21) {
    iVar3 = crosstets->log2objectsperblock;
    uVar4 = crosstets->objectsperblockmark;
    iVar5 = crosstets->objectbytes;
    iVar6 = this->elemmarkerindex;
    iVar7 = this->point2simindex;
    lVar18 = 0;
    do {
      pcVar8 = crosstets->toparray[(uint)lVar18 >> ((byte)iVar3 & 0x1f)];
      lVar17 = (long)(int)((uint)lVar18 & uVar4) * (long)iVar5;
      pcVar2 = pcVar8 + lVar17 + 8;
      pcVar2[0] = '\0';
      pcVar2[1] = '\0';
      pcVar2[2] = '\0';
      pcVar2[3] = '\0';
      iVar19 = 1;
      lVar12 = 0;
      lVar16 = 0;
      do {
        uVar14 = *(ulong *)(*(long *)(pcVar8 + lVar17) + lVar16 * 2);
        uVar11 = uVar14 & 0xfffffffffffffff0;
        if ((*(byte *)(uVar11 + (long)iVar6 * 4) & 1) == 0) {
          uVar22 = *(uint *)((long)fsymtbl[0] + lVar12 + (ulong)((uint)uVar14 & 0xf) * 4);
          *(ulong *)(*(long *)(pcVar8 + lVar17) + lVar16 * 2) =
               (long)*(int *)((long)bondtbl[0] + lVar12 + (long)(int)uVar22 * 4) | uVar11;
          *(ulong *)(uVar11 + (ulong)(uVar22 & 3) * 8) =
               (long)*(int *)((long)bondtbl[(int)uVar22] + lVar16) | *(ulong *)(pcVar8 + lVar17);
        }
        *(int *)(pcVar8 + lVar17 + 8) = iVar19;
        lVar16 = lVar16 + 4;
        lVar12 = lVar12 + 0x30;
        iVar19 = iVar19 + 1;
      } while (lVar16 != 0x10);
      pcVar2 = pcVar8 + lVar17 + 8;
      pcVar2[0] = '\0';
      pcVar2[1] = '\0';
      pcVar2[2] = '\0';
      pcVar2[3] = '\0';
      lVar12 = *(long *)(pcVar8 + lVar17);
      lVar16 = 4;
      do {
        *(long *)(*(long *)(lVar12 + lVar16 * 8) + (long)iVar7 * 8) = lVar12;
        lVar16 = lVar16 + 1;
      } while (lVar16 != 8);
      lVar18 = lVar18 + 1;
    } while (lVar18 != lVar21);
    if (0 < lVar21) {
      ppcVar13 = crosstets->toparray;
      lVar18 = 0;
      do {
        puVar1 = (uint *)(*(long *)(ppcVar13[(uint)lVar18 >>
                                             ((byte)crosstets->log2objectsperblock & 0x1f)] +
                                   (long)crosstets->objectbytes *
                                   (long)(int)(crosstets->objectsperblockmark & (uint)lVar18)) +
                         (long)this->elemmarkerindex * 4);
        *puVar1 = *puVar1 & 0xfffffffe;
        lVar18 = lVar18 + 1;
      } while (lVar21 != lVar18);
      goto LAB_00136ddb;
    }
  }
  ppcVar13 = crosstets->toparray;
LAB_00136ddb:
  pcVar2 = *ppcVar13;
  (this->recenttet).tet = *(tetrahedron **)pcVar2;
  (this->recenttet).ver = *(int *)(pcVar2 + 8);
  lVar21 = missingshbds->objects;
  if (0 < lVar21) {
    iVar3 = missingshbds->log2objectsperblock;
    uVar4 = missingshbds->objectsperblockmark;
    iVar5 = missingshbds->objectbytes;
    iVar6 = this->shmarkindex;
    lVar18 = 0;
    do {
      pcVar2 = missingshbds->toparray[(uint)lVar18 >> ((byte)iVar3 & 0x1f)];
      lVar12 = (long)(int)((uint)lVar18 & uVar4) * (long)iVar5;
      iVar7 = *(int *)(pcVar2 + lVar12 + 8);
      puVar20 = (undefined8 *)
                (*(ulong *)(*(long *)(pcVar2 + lVar12) + 0x30 + (long)(iVar7 >> 1) * 8) &
                0xfffffffffffffff8);
      if ((puVar20[3] != 0) && ((*(byte *)((long)puVar20 + (long)iVar6 * 4 + 4) & 1) != 0)) {
        uVar22 = (uint)puVar20[9] & 0xf;
        uVar11 = puVar20[9] & 0xfffffffffffffff0;
        uVar14 = uVar11;
        do {
          if (*(long *)(uVar14 + 0x40) != 0) {
            *(undefined8 *)(*(long *)(uVar14 + 0x40) + (long)ver2edge[(int)uVar22] * 8) = 0;
          }
          uVar9 = *(ulong *)(uVar14 + (long)facepivot1[(int)uVar22] * 8);
          uVar14 = uVar9 & 0xfffffffffffffff0;
          uVar22 = facepivot2[(int)uVar22][(uint)uVar9 & 0xf];
        } while (uVar14 != uVar11);
        pmVar10 = this->subsegs;
        puVar20[3] = 0;
        *puVar20 = pmVar10->deaditemstack;
        pmVar10->deaditemstack = puVar20;
        pmVar10->items = pmVar10->items + -1;
        *(undefined8 *)(*(long *)(pcVar2 + lVar12) + 0x30 + (long)(iVar7 >> 1) * 8) = 0;
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 != lVar21);
  }
  if (0 < topnewtets->objects) {
    lVar21 = 0;
    do {
      tetrahedrondealloc(this,*(tetrahedron **)
                               (topnewtets->toparray
                                [(uint)lVar21 >> ((byte)topnewtets->log2objectsperblock & 0x1f)] +
                               (long)topnewtets->objectbytes *
                               (long)(int)(topnewtets->objectsperblockmark & (uint)lVar21)));
      lVar21 = lVar21 + 1;
    } while (lVar21 < topnewtets->objects);
  }
  plVar15 = &topnewtets->objects;
  plVar23 = &crosstets->objects;
  if (botnewtets != (arraypool *)0x0) {
    if (0 < botnewtets->objects) {
      lVar21 = 0;
      do {
        tetrahedrondealloc(this,*(tetrahedron **)
                                 (botnewtets->toparray
                                  [(uint)lVar21 >> ((byte)botnewtets->log2objectsperblock & 0x1f)] +
                                 (long)botnewtets->objectbytes *
                                 (long)(int)(botnewtets->objectsperblockmark & (uint)lVar21)));
        lVar21 = lVar21 + 1;
      } while (lVar21 < botnewtets->objects);
    }
    plVar15 = &botnewtets->objects;
    crosstets->objects = 0;
    plVar23 = &topnewtets->objects;
  }
  *plVar23 = 0;
  *plVar15 = 0;
  return;
}

Assistant:

void tetgenmesh::restorecavity(arraypool *crosstets, arraypool *topnewtets,
                               arraypool *botnewtets, arraypool *missingshbds)
{
  triface *parytet, neightet, spintet;
  face *parysh;
  face checkseg;
  point *ppt;
  int t1ver;
  int i, j;

  // Reconnect crossing tets to cavity boundary.
  for (i = 0; i < crosstets->objects; i++) {
    parytet = (triface *) fastlookup(crosstets, i);
    parytet->ver = 0;
    for (parytet->ver = 0; parytet->ver < 4; parytet->ver++) {
      fsym(*parytet, neightet);
      if (!infected(neightet)) {
        // Restore the old connections of tets.
        bond(*parytet, neightet);
      }
    }
    // Update the point-to-tet map.
    parytet->ver = 0;
    ppt = (point *) &(parytet->tet[4]);
    for (j = 0; j < 4; j++) {
      setpoint2tet(ppt[j], encode(*parytet));
    }
  }

  // Uninfect all crossing tets.
  for (i = 0; i < crosstets->objects; i++) {
    parytet = (triface *) fastlookup(crosstets, i);
    uninfect(*parytet);
  }

  // Remember a live handle.
  recenttet = * (triface *) fastlookup(crosstets, 0);

  // Delete faked segments.
  for (i = 0; i < missingshbds->objects; i++) {
    parysh = (face *) fastlookup(missingshbds, i);
    sspivot(*parysh, checkseg);
    if (checkseg.sh[3] != NULL) {
      if (sinfected(checkseg)) {
            // It's a faked segment. Delete it.
        sstpivot1(checkseg, neightet);
        spintet = neightet;
        while (1) {
          tssdissolve1(spintet);
          fnextself(spintet);
          if (spintet.tet == neightet.tet) break;
        }
        shellfacedealloc(subsegs, checkseg.sh);
        ssdissolve(*parysh);
        //checkseg.sh = NULL;
      }
    }
  } // i

  // Delete new tets.
  for (i = 0; i < topnewtets->objects; i++) {
    parytet = (triface *) fastlookup(topnewtets, i);
    tetrahedrondealloc(parytet->tet);
  }

  if (botnewtets != NULL) {
    for (i = 0; i < botnewtets->objects; i++) {
      parytet = (triface *) fastlookup(botnewtets, i);
      tetrahedrondealloc(parytet->tet);
    }
  }

  crosstets->restart();
  topnewtets->restart();
  if (botnewtets != NULL) {
    botnewtets->restart();
  }
}